

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cpp
# Opt level: O2

void fixFileName(CBString *name,bool replaceSpaces)

{
  uchar *puVar1;
  uchar uVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  CBCharWriteProtected local_40;
  
  uVar3 = (name->super_tagbstring).slen;
  uVar6 = 0;
  uVar5 = 0;
  if (0 < (int)uVar3) {
    uVar5 = (ulong)uVar3;
  }
  do {
    if (uVar6 == uVar5) {
      if (uVar3 == 0) {
        Bstrlib::CBString::operator=(name,"_");
      }
      return;
    }
    if (uVar6 < (uint)(name->super_tagbstring).slen) {
      uVar2 = (name->super_tagbstring).data[uVar6];
      if ((uVar2 != ' ' || !replaceSpaces) && '\x1f' < (char)uVar2) {
        lVar4 = 0;
        do {
          if (lVar4 == 9) goto LAB_0013fc3b;
          puVar1 = &DAT_0017439c + lVar4;
          lVar4 = lVar4 + 1;
        } while (uVar2 != *puVar1);
      }
    }
    local_40.idx = (uint)uVar6;
    local_40.s = &name->super_tagbstring;
    Bstrlib::CBCharWriteProtected::operator=(&local_40,'_');
LAB_0013fc3b:
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

void fixFileName(UString &name, bool replaceSpaces)
{
    // Replace some symbols with underscores for compatibility
    const char table[] = {
        '/', // Banned in *nix and Windows
        '<', '>', ':', '\"', '\\', '|', '?', '*', // Banned in Windows
    };
    int nameLength = (int)name.length(); // Note: Qt uses int for whatever reason.
    for (int i = 0; i < nameLength; i++) {
        if (
            name[i] < (char)0x20 || // ASCII control characters, banned in Windows, hard to work with in *nix
            name[i] > (char)0x7f || // high ASCII characters
            (replaceSpaces && name[i] == ' ') // Provides better readability
            ) {
                name[i] = '_';
                continue;
            }
        for (size_t j = 0; j < sizeof(table); j++) {
            if (name[i] == table[j]) {
                name[i] = '_';
                break;
            }
        }
    }
    if (!nameLength) {
        name = "_";
    }
}